

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void ff_white_mage(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x1335,0xf,3,0,0x43,2,3,3,3,0,3,0,0x43,3,0x43,2,0x43);
  vpatch(rom,0x1395,0xf,3,0xc,0x43,0xf,0x43,0xe,0x43,0xc,3,0xc,0x43,0xe,3,0xf,3);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0);
  vpatch(rom,0x1415,0xf,3,0xc5,3,0xc6,3,199,3,0xc4,3,200,3,0xc9,3,0xca,3);
  vpatch(rom,0x1435,0xf,3,5,3,6,3,7,3,4,3,5,3,8,3,9,3);
  vpatch(rom,0x1495,0xf,3,0x11,3,0x14,3,0x15,3,0x10,3,0x11,3,0x12,3,0x13,3);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x1515,0xf,3,0xcb,3,0xcc,3,0xcd,3,0xce,3,0xcf,3,0xd0,3,0xd1,3);
  vpatch(rom,0x1535,0xf,3,1,0x43,10,3,0xb,3,1,3,1,0x43,0xb,0x43,10,0x43);
  vpatch(rom,0x1595,0xf,3,0xd,0x43,0x16,3,0x17,3,0xd,3,0xd,0x43,0x17,0x43,0x16,0x43);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x1615,0xf,3,0xd3,3,0xd4,3,0xd5,3,0xd6,3,0xd3,3,0xd7,3,0x92,3);
  vpatch(rom,0x1635,0xf,0x43,4,0x43,7,0x43,6,0x43,5,0x43,4,0x43,9,0x43,8,0x43);
  vpatch(rom,0x1695,0xf,0x43,0x10,0x43,0x15,0x43,0x14,0x43,0x11,0x43,0x10,0x43,0x13,0x43,0x12,0x43);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39);
  vpatch(rom,0x1a8b,3,0x30,0x37,0xf);
  vpatch(rom,0x12300,0x80,3,7,0xf,0xf,0x1f,0x1c,0x3e,0x3a,2,4,8,8,0x13,0x17,0x27,0x37,0xc0,0xe0,0xf0
         ,0xf0,0xf8,0x38,0x7c,0x5c,0x40,0x20,0x10,0x10,200,0xe8,0xe4,0xec,0x7c,0xff,0xdf,0xcf,0xff,
         0xff,0xff,0x7f,0x4b,0x84,0xab,0xb4,0xb6,0xa9,0xa8,0x5f,0x3c,0xe6,0xe7,0xff,0xff,0xff,0xbf,
         0x1c,0xd4,0x3a,0xd9,0x59,0x59,0xdb,0x6b,0xf4,3,7);
  vpatch(rom,0x12400,0x180,0,3,0xf,0x1f,0x1f,9,0xb,10,0,3,0xc,0x10,0x16,0xf,0xf,0xf,0xfe,0xfe,0xfc,
         0xfc,0xfc,0xfe,0xfe,0xfc,0xfe,2,4,0xc,4,2,0x82,0x84,9,0xf,9,9,0xf,0xf,0xf,0xf,0xe,9,0xe,0xe
         ,10,10,10,0xb,0xf8,0xf8,0xfc,0xfc,0xfc,0xfe,0xff,0xff,0x38,200,4,4,0x14,0x12,0x21,0xc1,0,0)
  ;
  ff_spells(rom);
  return;
}

Assistant:

static void ff_white_mage(dw_rom *rom)
{
    vpatch(rom, 0x01335,   15,  0x03,  0x00,  0x43,  0x02,  0x03,  0x03,  0x03,  0x00,  0x03,  0x00,  0x43,  0x03,  0x43,  0x02,  0x43);
    vpatch(rom, 0x01395,   15,  0x03,  0x0c,  0x43,  0x0f,  0x43,  0x0e,  0x43,  0x0c,  0x03,  0x0c,  0x43,  0x0e,  0x03,  0x0f,  0x03);
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x01415,   15,  0x03,  0xc5,  0x03,  0xc6,  0x03,  0xc7,  0x03,  0xc4,  0x03,  0xc8,  0x03,  0xc9,  0x03,  0xca,  0x03);
    vpatch(rom, 0x01435,   15,  0x03,  0x05,  0x03,  0x06,  0x03,  0x07,  0x03,  0x04,  0x03,  0x05,  0x03,  0x08,  0x03,  0x09,  0x03);
    vpatch(rom, 0x01495,   15,  0x03,  0x11,  0x03,  0x14,  0x03,  0x15,  0x03,  0x10,  0x03,  0x11,  0x03,  0x12,  0x03,  0x13,  0x03);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x01515,   15,  0x03,  0xcb,  0x03,  0xcc,  0x03,  0xcd,  0x03,  0xce,  0x03,  0xcf,  0x03,  0xd0,  0x03,  0xd1,  0x03);
    vpatch(rom, 0x01535,   15,  0x03,  0x01,  0x43,  0x0a,  0x03,  0x0b,  0x03,  0x01,  0x03,  0x01,  0x43,  0x0b,  0x43,  0x0a,  0x43);
    vpatch(rom, 0x01595,   15,  0x03,  0x0d,  0x43,  0x16,  0x03,  0x17,  0x03,  0x0d,  0x03,  0x0d,  0x43,  0x17,  0x43,  0x16,  0x43);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x01615,   15,  0x03,  0xd3,  0x03,  0xd4,  0x03,  0xd5,  0x03,  0xd6,  0x03,  0xd3,  0x03,  0xd7,  0x03,  0x92,  0x03);
    vpatch(rom, 0x01635,   15,  0x43,  0x04,  0x43,  0x07,  0x43,  0x06,  0x43,  0x05,  0x43,  0x04,  0x43,  0x09,  0x43,  0x08,  0x43);
    vpatch(rom, 0x01695,   15,  0x43,  0x10,  0x43,  0x15,  0x43,  0x14,  0x43,  0x11,  0x43,  0x10,  0x43,  0x13,  0x43,  0x12,  0x43);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x30,  0x37,  0x0f);
    vpatch(rom, 0x12300,  128,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1c,  0x3e,  0x3a,  0x02,  0x04,  0x08,  0x08,  0x13,  0x17,  0x27,  0x37,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0x38,  0x7c,  0x5c,  0x40,  0x20,  0x10,  0x10,  0xc8,  0xe8,  0xe4,  0xec,  0x7c,  0xff,  0xdf,  0xcf,  0xff,  0xff,  0xff,  0x7f,  0x4b,  0x84,  0xab,  0xb4,  0xb6,  0xa9,  0xa8,  0x5f,  0x3c,  0xe6,  0xe7,  0xff,  0xff,  0xff,  0xbf,  0x1c,  0xd4,  0x3a,  0xd9,  0x59,  0x59,  0xdb,  0x6b,  0xf4,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1c,  0x3e,  0x3a,  0x02,  0x04,  0x08,  0x08,  0x13,  0x17,  0x27,  0x37,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0x38,  0x7c,  0x5c,  0x40,  0x20,  0x10,  0x10,  0xc8,  0xe8,  0xe4,  0xec,  0x3c,  0x67,  0xe7,  0xff,  0xff,  0xff,  0xfd,  0x38,  0x2b,  0x5c,  0x9b,  0x9a,  0x9a,  0xdb,  0xd6,  0x2f,  0x3e,  0xff,  0xfb,  0xf3,  0xff,  0xff,  0xff,  0xfe,  0xd2,  0x21,  0xd5,  0x2d,  0x6d,  0x95,  0x15,  0xfa);
    vpatch(rom, 0x12400,  384,  0x00,  0x03,  0x0f,  0x1f,  0x1f,  0x09,  0x0b,  0x0a,  0x00,  0x03,  0x0c,  0x10,  0x16,  0x0f,  0x0f,  0x0f,  0xfe,  0xfe,  0xfc,  0xfc,  0xfc,  0xfe,  0xfe,  0xfc,  0xfe,  0x02,  0x04,  0x0c,  0x04,  0x02,  0x82,  0x84,  0x09,  0x0f,  0x09,  0x09,  0x0f,  0x0f,  0x0f,  0x0f,  0x0e,  0x09,  0x0e,  0x0e,  0x0a,  0x0a,  0x0a,  0x0b,  0xf8,  0xf8,  0xfc,  0xfc,  0xfc,  0xfe,  0xff,  0xff,  0x38,  0xc8,  0x04,  0x04,  0x14,  0x12,  0x21,  0xc1,  0x00,  0x00,  0x03,  0x0f,  0x1f,  0x1f,  0x09,  0x0b,  0x00,  0x00,  0x03,  0x0c,  0x10,  0x16,  0x0f,  0x0f,  0x00,  0xfe,  0xfe,  0xfc,  0xfc,  0xfc,  0xfe,  0xfe,  0x00,  0xfe,  0x02,  0x04,  0x0c,  0x04,  0x02,  0x82,  0x0a,  0x09,  0x0f,  0x0f,  0x09,  0x09,  0x1f,  0x13,  0x0f,  0x0e,  0x09,  0x0e,  0x0e,  0x0e,  0x1a,  0x1e,  0xfc,  0xf8,  0xf8,  0xfc,  0xfc,  0xfc,  0xfe,  0xff,  0x84,  0x68,  0x88,  0x04,  0x04,  0x14,  0x12,  0x11,  0x00,  0x7f,  0x7f,  0x3f,  0x3f,  0x3f,  0x7f,  0x7f,  0x00,  0x7f,  0x40,  0x20,  0x30,  0x20,  0x40,  0x41,  0x00,  0x00,  0xc0,  0xf0,  0xf8,  0xf8,  0x90,  0xd0,  0x00,  0x00,  0xc0,  0x30,  0x08,  0x68,  0xf0,  0xf0,  0x3f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3f,  0x7f,  0xff,  0x21,  0x16,  0x11,  0x20,  0x20,  0x28,  0x48,  0x88,  0x50,  0x90,  0xf0,  0xf0,  0x90,  0x90,  0xf8,  0xc8,  0xf0,  0x70,  0x90,  0x70,  0x70,  0x70,  0x58,  0x78,  0x7f,  0x7f,  0x3f,  0x3f,  0x3f,  0x7f,  0x7f,  0x3f,  0x7f,  0x40,  0x20,  0x30,  0x20,  0x40,  0x41,  0x21,  0x00,  0xc0,  0xf0,  0xf8,  0xf8,  0x90,  0xd0,  0x50,  0x00,  0xc0,  0x30,  0x08,  0x68,  0xf0,  0xf0,  0xf0,  0x1f,  0x1f,  0x3f,  0x3f,  0x3f,  0x7f,  0xff,  0xff,  0x1c,  0x13,  0x20,  0x20,  0x28,  0x48,  0x84,  0x83,  0x90,  0xf0,  0x90,  0x90,  0xf0,  0xf0,  0xf0,  0xf0,  0x70,  0x90,  0x70,  0x70,  0x50,  0x50,  0x50,  0xd0,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x02,  0x04,  0x08,  0x08,  0x10,  0x10,  0x20,  0x30,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0x40,  0x20,  0x10,  0x10,  0x08,  0x08,  0x04,  0x0c,  0x7f,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0x7f,  0x48,  0x84,  0x83,  0x84,  0x83,  0x80,  0xc0,  0x63,  0xfc,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xff,  0x1c,  0x14,  0x22,  0xc1,  0x01,  0xa1,  0x01,  0xe3,  0xfc,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x02,  0x04,  0x08,  0x08,  0x10,  0x10,  0x20,  0x30,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0x40,  0x20,  0x10,  0x10,  0x08,  0x08,  0x04,  0x0c,  0x3f,  0x7f,  0xff,  0xff,  0xff,  0xff,  0xff,  0x38,  0x28,  0x44,  0x83,  0x80,  0x85,  0x80,  0xc7,  0x3f,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0xfe,  0x12,  0x21,  0xc1,  0x21,  0xc1,  0x01,  0x03,  0xc6);
    ff_spells(rom);
}